

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fingergeometry.cpp
# Opt level: O2

int QtMWidgets::FingerGeometry::width(void)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  if (width()::w == '\0') {
    iVar1 = __cxa_guard_acquire(&width()::w);
    if (iVar1 != 0) {
      QGuiApplication::primaryScreen();
      dVar2 = (double)QScreen::logicalDotsPerInchX();
      QGuiApplication::primaryScreen();
      dVar3 = (double)QScreen::physicalDotsPerInchX();
      if (dVar3 <= dVar2) {
        dVar3 = dVar2;
      }
      width::w = (int)((double)((ulong)(dVar3 * 0.393700787) & 0x8000000000000000 |
                               (ulong)DAT_0018cc90) + dVar3 * 0.393700787);
      __cxa_guard_release(&width()::w);
    }
  }
  return width::w;
}

Assistant:

int
FingerGeometry::width()
{
#ifdef Q_OS_ANDROID

	static const int w =
		qRound( qgetenv( "QT_ANDROID_THEME_DISPLAY_DPI" ).toDouble() *
			fingerSize );

	return w;

#else

	static const int w =
		qRound(
			(qreal) qMax( QApplication::primaryScreen()->logicalDotsPerInchX(),
				QApplication::primaryScreen()->physicalDotsPerInchX() ) *
			fingerSize );

	return w;

#endif
}